

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> * __thiscall
pbrt::ParameterDictionary::extractSpectrumArray
          (ParameterDictionary *this,ParsedParameter *param,SpectrumType spectrumType,
          Allocator alloc)

{
  anon_class_16_2_f782e422 convert;
  anon_class_32_4_c2a45de6 convert_00;
  bool bVar1;
  size_t sVar2;
  long in_RDX;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *in_RSI;
  anon_class_232_4_5824d276 *in_RDI;
  int nSamples;
  char *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  anon_class_232_4_5824d276 *convert_01;
  int nPerItem;
  ParsedParameter *in_stack_fffffffffffffdd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdd8;
  ParsedParameter *in_stack_fffffffffffffde8;
  ParsedParameter *in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf8 [24];
  
  convert_01 = in_RDI;
  bVar1 = std::operator==(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  if ((bVar1) ||
     (((*(byte *)(Options + 0xb) & 1) != 0 &&
      (bVar1 = std::operator==(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68), bVar1)))) {
    convert_00.spectrumType = in_stack_fffffffffffffdf8._0_4_;
    convert_00._12_4_ = in_stack_fffffffffffffdf8._4_4_;
    convert_00.alloc = (Allocator *)in_stack_fffffffffffffdf8._8_8_;
    convert_00.param = (ParsedParameter *)in_stack_fffffffffffffdf8._16_8_;
    convert_00.this = (ParameterDictionary *)in_stack_fffffffffffffdf0;
    returnArray<pbrt::SpectrumHandle,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>,pbrt::ParameterDictionary::extractSpectrumArray(pbrt::ParsedParameter_const&,pbrt::SpectrumType,pstd::pmr::polymorphic_allocator<std::byte>)const::__0>
              ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,(int)((ulong)in_RSI >> 0x20),
               convert_00);
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    if (bVar1) {
      convert.alloc = (Allocator *)in_stack_fffffffffffffdd8;
      convert.this = (ParameterDictionary *)in_stack_fffffffffffffdd0;
      returnArray<pbrt::SpectrumHandle,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>,pbrt::ParameterDictionary::extractSpectrumArray(pbrt::ParsedParameter_const&,pbrt::SpectrumType,pstd::pmr::polymorphic_allocator<std::byte>)const::__1>
                (in_RSI,(ParsedParameter *)convert_01,(int)((ulong)in_RDI >> 0x20),convert);
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      nPerItem = (int)((ulong)in_RSI >> 0x20);
      if ((!bVar1) ||
         (bVar1 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::empty
                            ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)0x74db7b),
         bVar1)) {
        bVar1 = std::operator==(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        if ((!bVar1) ||
           (bVar1 = pstd::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x74dcc7), bVar1)) {
          memset(in_RDI,0,0x18);
          std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                    ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)0x74dd74
                    );
        }
        else {
          ParsedParameter::ParsedParameter(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          returnArray<pbrt::SpectrumHandle,pstd::vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>,pbrt::ParameterDictionary::extractSpectrumArray(pbrt::ParsedParameter_const&,pbrt::SpectrumType,pstd::pmr::polymorphic_allocator<std::byte>)const::__3>
                    (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,nPerItem,
                     (anon_class_216_2_272f9d75 *)convert_01);
          extractSpectrumArray(pbrt::ParsedParameter_const&,pbrt::SpectrumType,pstd::pmr::polymorphic_allocator<std::byte>)
          ::~__3((anon_class_216_2_272f9d75 *)0x74dd31);
        }
      }
      else {
        sVar2 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size
                          ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)
                           (in_RDX + 0x58));
        if ((sVar2 & 1) != 0) {
          ErrorExit<std::__cxx11::string_const&>
                    ((FileLoc *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                     in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        }
        pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size
                  ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)(in_RDX + 0x58));
        pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size
                  ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)(in_RDX + 0x58));
        ParsedParameter::ParsedParameter(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        returnArray<pbrt::SpectrumHandle,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>,pbrt::ParameterDictionary::extractSpectrumArray(pbrt::ParsedParameter_const&,pbrt::SpectrumType,pstd::pmr::polymorphic_allocator<std::byte>)const::__2>
                  ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)
                   in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,nPerItem,convert_01);
        extractSpectrumArray(pbrt::ParsedParameter_const&,pbrt::SpectrumType,pstd::pmr::polymorphic_allocator<std::byte>)
        ::~__2((anon_class_232_4_5824d276 *)0x74dc6e);
      }
    }
  }
  return (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)convert_01;
}

Assistant:

std::vector<SpectrumHandle> ParameterDictionary::extractSpectrumArray(
    const ParsedParameter &param, SpectrumType spectrumType, Allocator alloc) const {
    if (param.type == "rgb" || (Options->upgrade && param.type == "color"))
        return returnArray<SpectrumHandle>(
            param.numbers, param, 3,
            [this, spectrumType, &alloc, &param](const double *v,
                                                 const FileLoc *loc) -> SpectrumHandle {
                RGB rgb(v[0], v[1], v[2]);
                const RGBColorSpace &cs =
                    param.colorSpace ? *param.colorSpace : *colorSpace;
                if (spectrumType == SpectrumType::Reflectance) {
                    if (std::min({v[0], v[1], v[2]}) < 0 ||
                        std::max({v[0], v[1], v[2]}) > 1)
                        ErrorExit(&param.loc,
                                  "RGB reflectance parameter \"%s\" has "
                                  "parameter outside of [0,1].",
                                  param.name);
                    return alloc.new_object<RGBReflectanceSpectrum>(cs, rgb);
                } else {
                    CHECK(spectrumType == SpectrumType::General);
                    if (std::min({v[0], v[1], v[2]}) < 0)
                        ErrorExit(&param.loc,
                                  "RGB parameter \"%s\" has negative component value.");
                    return alloc.new_object<RGBSpectrum>(cs, rgb);
                }
            });
    else if (param.type == "blackbody")
        return returnArray<SpectrumHandle>(
            param.numbers, param, 1,
            [this, &alloc](const double *v, const FileLoc *loc) -> SpectrumHandle {
                return alloc.new_object<BlackbodySpectrum>(v[0]);
            });
    else if (param.type == "spectrum" && !param.numbers.empty()) {
        if (param.numbers.size() % 2 != 0)
            ErrorExit(&param.loc, "Found odd number of values for \"%s\"", param.name);

        int nSamples = param.numbers.size() / 2;
        return returnArray<SpectrumHandle>(
            param.numbers, param, param.numbers.size(),
            [this, nSamples, &alloc, param](const double *v,
                                            const FileLoc *Loc) -> SpectrumHandle {
                std::vector<Float> lambda(nSamples), value(nSamples);
                for (int i = 0; i < nSamples; ++i) {
                    if (i > 0 && v[2 * i] <= lambda[i - 1])
                        ErrorExit(&param.loc,
                                  "Spectrum description invalid: at %d'th entry, "
                                  "wavelengths aren't increasing: %f >= %f.",
                                  i - 1, lambda[i - 1], v[2 * i]);
                    lambda[i] = v[2 * i];
                    value[i] = v[2 * i + 1];
                }
                return alloc.new_object<PiecewiseLinearSpectrum>(lambda, value, alloc);
            });
    } else if (param.type == "spectrum" && !param.strings.empty())
        return returnArray<SpectrumHandle>(
            param.strings, param, 1,
            [param, &alloc](const std::string *s, const FileLoc *loc) -> SpectrumHandle {
                SpectrumHandle spd = GetNamedSpectrum(*s);
                if (spd)
                    return spd;

                spd = readSpectrumFromFile(*s, alloc);
                if (!spd)
                    ErrorExit(&param.loc, "%s: unable to read valid spectrum file", *s);
                return spd;
            });

    return {};
}